

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O0

void Eigen::internal::
     general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_1,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_false,_1>
     ::run(long rows,long cols,const_blas_data_mapper<float,_long,_1> *alhs,
          const_blas_data_mapper<float,_long,_1> *rhs,ResScalar *res,long resIncr,ResScalar alpha)

{
  long lVar1;
  long lVar2;
  float fVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dc_20;
  undefined4 extraout_XMM0_Dc_21;
  undefined4 extraout_XMM0_Dc_22;
  undefined4 extraout_XMM0_Dc_23;
  undefined4 extraout_XMM0_Dc_24;
  undefined4 extraout_XMM0_Dc_25;
  undefined4 extraout_XMM0_Dc_26;
  undefined4 extraout_XMM0_Dc_27;
  undefined4 extraout_XMM0_Dc_28;
  undefined4 extraout_XMM0_Dc_29;
  undefined4 extraout_XMM0_Dc_30;
  undefined4 extraout_XMM0_Dc_31;
  undefined4 extraout_XMM0_Dc_32;
  undefined4 extraout_XMM0_Dc_33;
  undefined4 extraout_XMM0_Dc_34;
  undefined4 extraout_XMM0_Dc_35;
  undefined4 extraout_XMM0_Dc_36;
  undefined4 extraout_XMM0_Dc_37;
  undefined4 extraout_XMM0_Dc_38;
  undefined4 extraout_XMM0_Dc_39;
  undefined4 extraout_XMM0_Dc_40;
  undefined4 extraout_XMM0_Dc_41;
  undefined4 extraout_XMM0_Dc_42;
  undefined4 extraout_XMM0_Dc_43;
  undefined4 extraout_XMM0_Dc_44;
  undefined4 extraout_XMM0_Dc_45;
  undefined4 extraout_XMM0_Dc_46;
  undefined4 extraout_XMM0_Dc_47;
  undefined4 extraout_XMM0_Dc_48;
  undefined4 extraout_XMM0_Dc_49;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  float extraout_XMM0_Dd_04;
  float extraout_XMM0_Dd_05;
  float extraout_XMM0_Dd_06;
  float extraout_XMM0_Dd_07;
  float extraout_XMM0_Dd_08;
  float extraout_XMM0_Dd_09;
  float extraout_XMM0_Dd_10;
  float extraout_XMM0_Dd_11;
  float extraout_XMM0_Dd_12;
  float extraout_XMM0_Dd_13;
  float extraout_XMM0_Dd_14;
  float extraout_XMM0_Dd_15;
  float extraout_XMM0_Dd_16;
  float extraout_XMM0_Dd_17;
  float extraout_XMM0_Dd_18;
  float extraout_XMM0_Dd_19;
  float extraout_XMM0_Dd_20;
  float extraout_XMM0_Dd_21;
  float extraout_XMM0_Dd_22;
  float extraout_XMM0_Dd_23;
  float extraout_XMM0_Dd_24;
  float extraout_XMM0_Dd_25;
  float extraout_XMM0_Dd_26;
  float extraout_XMM0_Dd_27;
  float extraout_XMM0_Dd_28;
  float extraout_XMM0_Dd_29;
  float extraout_XMM0_Dd_30;
  float extraout_XMM0_Dd_31;
  float extraout_XMM0_Dd_32;
  float extraout_XMM0_Dd_33;
  float extraout_XMM0_Dd_34;
  float extraout_XMM0_Dd_35;
  float extraout_XMM0_Dd_36;
  float extraout_XMM0_Dd_37;
  float extraout_XMM0_Dd_38;
  float extraout_XMM0_Dd_39;
  float extraout_XMM0_Dd_40;
  float extraout_XMM0_Dd_41;
  float extraout_XMM0_Dd_42;
  float extraout_XMM0_Dd_43;
  float extraout_XMM0_Dd_44;
  undefined4 extraout_XMM0_Dd_45;
  undefined4 extraout_XMM0_Dd_46;
  float extraout_XMM0_Dd_47;
  float extraout_XMM0_Dd_48;
  float extraout_XMM0_Dd_49;
  Packet4f afVar4;
  float afVar5 [4];
  long local_a28;
  float local_a1c;
  ResScalar cc0_3;
  float afStack_a18 [4];
  undefined1 auStack_a08 [8];
  RhsPacket b0_6;
  long j_3;
  undefined1 auStack_9e8 [8];
  ResPacketQuarter c0_q;
  float local_9cc;
  undefined1 auStack_9c8 [8];
  ResPacketHalf c0_h;
  float local_9ac;
  undefined1 auStack_9a8 [8];
  ResPacket c0_3;
  float local_990;
  float b0_5;
  ResScalar cc1_2;
  ResScalar cc0_2;
  float local_978 [4];
  undefined1 auStack_968 [8];
  RhsPacket b0_4;
  long j_2;
  undefined1 auStack_948 [8];
  ResPacket c1_2;
  float local_92c;
  undefined1 auStack_928 [8];
  ResPacket c0_2;
  float local_90c;
  float local_908;
  float b0_3;
  ResScalar cc3_1;
  ResScalar cc2_1;
  ResScalar cc1_1;
  ResScalar cc0_1;
  float local_8e8 [4];
  float local_8d8 [4];
  float local_8c8 [4];
  undefined1 auStack_8b8 [8];
  RhsPacket b0_2;
  long j_1;
  undefined1 auStack_898 [8];
  ResPacket c3_1;
  float local_87c;
  undefined1 auStack_878 [8];
  ResPacket c2_1;
  float local_85c;
  undefined1 auStack_858 [8];
  ResPacket c1_1;
  float local_83c;
  undefined1 auStack_838 [8];
  ResPacket c0_1;
  float local_81c;
  float local_818;
  float b0_1;
  ResScalar cc7;
  ResScalar cc6;
  ResScalar cc5;
  ResScalar cc4;
  ResScalar cc3;
  ResScalar cc2;
  ResScalar cc1;
  ResScalar cc0;
  float local_7e8 [4];
  float local_7d8 [4];
  float local_7c8 [4];
  float local_7b8 [4];
  float local_7a8 [4];
  float local_798 [4];
  float local_788 [4];
  undefined1 auStack_778 [8];
  RhsPacket b0;
  long j;
  undefined1 auStack_758 [8];
  ResPacket c7;
  float local_73c;
  undefined1 auStack_738 [8];
  ResPacket c6;
  float local_71c;
  undefined1 auStack_718 [8];
  ResPacket c5;
  float local_6fc;
  undefined1 auStack_6f8 [8];
  ResPacket c4;
  float local_6dc;
  undefined1 auStack_6d8 [8];
  ResPacket c3;
  float local_6bc;
  undefined1 auStack_6b8 [8];
  ResPacket c2;
  float local_69c;
  undefined1 auStack_698 [8];
  ResPacket c1;
  float local_67c;
  undefined1 auStack_678 [8];
  ResPacket c0;
  long i;
  long n2;
  long n4;
  long n8;
  undefined1 auStack_640 [4];
  conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
  pcj_quarter;
  conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
  pcj_half;
  conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
  pcj;
  conj_helper<float,_float,_false,_false> cj;
  const_blas_data_mapper<float,_long,_1> lhs;
  ResScalar alpha_local;
  long resIncr_local;
  ResScalar *res_local;
  const_blas_data_mapper<float,_long,_1> *rhs_local;
  const_blas_data_mapper<float,_long,_1> *alhs_local;
  long cols_local;
  long rows_local;
  
  _auStack_640 = (alhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data;
  lVar1 = (alhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride;
  lVar2 = blas_data_mapper<const_float,_long,_1,_0,_1>::stride
                    ((blas_data_mapper<const_float,_long,_1,_0,_1> *)auStack_640);
  if ((ulong)(lVar2 * 4) < 0x7d01) {
    local_a28 = rows + -7;
  }
  else {
    local_a28 = 0;
  }
  c0[2] = 0.0;
  c0[3] = 0.0;
  for (; (long)c0._8_8_ < local_a28; c0._8_8_ = c0._8_8_ + 8) {
    local_67c = 0.0;
    afVar4 = pset1<float__vector(4)>(&local_67c);
    unique0x100002ea = (float)extraout_XMM0_Dc;
    auStack_678._0_4_ = (float)(int)afVar4._0_8_;
    auStack_678._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
    unique0x100002ee = extraout_XMM0_Dd;
    local_69c = 0.0;
    afVar4 = pset1<float__vector(4)>(&local_69c);
    unique0x1000030e = (float)extraout_XMM0_Dc_00;
    auStack_698._0_4_ = (float)(int)afVar4._0_8_;
    auStack_698._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
    unique0x10000312 = extraout_XMM0_Dd_00;
    local_6bc = 0.0;
    afVar4 = pset1<float__vector(4)>(&local_6bc);
    unique0x10000332 = (float)extraout_XMM0_Dc_01;
    auStack_6b8._0_4_ = (float)(int)afVar4._0_8_;
    auStack_6b8._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
    unique0x10000336 = extraout_XMM0_Dd_01;
    local_6dc = 0.0;
    afVar4 = pset1<float__vector(4)>(&local_6dc);
    unique0x10000356 = (float)extraout_XMM0_Dc_02;
    auStack_6d8._0_4_ = (float)(int)afVar4._0_8_;
    auStack_6d8._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
    unique0x1000035a = extraout_XMM0_Dd_02;
    local_6fc = 0.0;
    afVar4 = pset1<float__vector(4)>(&local_6fc);
    unique0x1000037a = (float)extraout_XMM0_Dc_03;
    auStack_6f8._0_4_ = (float)(int)afVar4._0_8_;
    auStack_6f8._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
    unique0x1000037e = extraout_XMM0_Dd_03;
    local_71c = 0.0;
    afVar4 = pset1<float__vector(4)>(&local_71c);
    unique0x1000039e = (float)extraout_XMM0_Dc_04;
    auStack_718._0_4_ = (float)(int)afVar4._0_8_;
    auStack_718._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
    unique0x100003a2 = extraout_XMM0_Dd_04;
    local_73c = 0.0;
    afVar4 = pset1<float__vector(4)>(&local_73c);
    unique0x100003c2 = (float)extraout_XMM0_Dc_05;
    auStack_738._0_4_ = (float)(int)afVar4._0_8_;
    auStack_738._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
    unique0x100003c6 = extraout_XMM0_Dd_05;
    j._4_4_ = 0;
    afVar4 = pset1<float__vector(4)>((float *)((long)&j + 4));
    unique0x100003e6 = (float)extraout_XMM0_Dc_06;
    auStack_758._0_4_ = (float)(int)afVar4._0_8_;
    auStack_758._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
    unique0x100003ea = extraout_XMM0_Dd_06;
    b0[2] = 0.0;
    b0[3] = 0.0;
    for (; b0._8_8_ + 4 <= cols; b0._8_8_ = b0._8_8_ + 4) {
      afVar4 = ploadu<float__vector(4)>
                         ((rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data +
                          b0._8_8_ *
                          (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride);
      unique0x1000040a = (float)extraout_XMM0_Dc_07;
      auStack_778._0_4_ = (float)(int)afVar4._0_8_;
      auStack_778._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      unique0x1000040e = extraout_XMM0_Dd_07;
      afVar4 = ploadu<float__vector(4)>(_auStack_640 + b0._8_8_ + c0._8_8_ * lVar1);
      local_788[2] = (float)extraout_XMM0_Dc_08;
      local_788[0] = (float)(int)afVar4._0_8_;
      local_788[1] = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      local_788[3] = extraout_XMM0_Dd_08;
      afVar5 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                        *)((long)&n8 + 6),&local_788,(float (*) [4])auStack_778,
                       (float (*) [4])auStack_678);
      unique0x10000452 = (float)extraout_XMM0_Dc_09;
      auStack_678._0_4_ = (float)(int)afVar5._0_8_;
      auStack_678._4_4_ = (float)(int)((ulong)afVar5._0_8_ >> 0x20);
      unique0x10000456 = extraout_XMM0_Dd_09;
      afVar4 = ploadu<float__vector(4)>(_auStack_640 + b0._8_8_ + (c0._8_8_ + 1) * lVar1);
      local_798[2] = (float)extraout_XMM0_Dc_10;
      local_798[0] = (float)(int)afVar4._0_8_;
      local_798[1] = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      local_798[3] = extraout_XMM0_Dd_10;
      afVar5 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                        *)((long)&n8 + 6),&local_798,(float (*) [4])auStack_778,
                       (float (*) [4])auStack_698);
      unique0x1000049a = (float)extraout_XMM0_Dc_11;
      auStack_698._0_4_ = (float)(int)afVar5._0_8_;
      auStack_698._4_4_ = (float)(int)((ulong)afVar5._0_8_ >> 0x20);
      unique0x1000049e = extraout_XMM0_Dd_11;
      afVar4 = ploadu<float__vector(4)>(_auStack_640 + b0._8_8_ + (c0._8_8_ + 2) * lVar1);
      local_7a8[2] = (float)extraout_XMM0_Dc_12;
      local_7a8[0] = (float)(int)afVar4._0_8_;
      local_7a8[1] = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      local_7a8[3] = extraout_XMM0_Dd_12;
      afVar5 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                        *)((long)&n8 + 6),&local_7a8,(float (*) [4])auStack_778,
                       (float (*) [4])auStack_6b8);
      unique0x100004e2 = (float)extraout_XMM0_Dc_13;
      auStack_6b8._0_4_ = (float)(int)afVar5._0_8_;
      auStack_6b8._4_4_ = (float)(int)((ulong)afVar5._0_8_ >> 0x20);
      unique0x100004e6 = extraout_XMM0_Dd_13;
      afVar4 = ploadu<float__vector(4)>(_auStack_640 + b0._8_8_ + (c0._8_8_ + 3) * lVar1);
      local_7b8[2] = (float)extraout_XMM0_Dc_14;
      local_7b8[0] = (float)(int)afVar4._0_8_;
      local_7b8[1] = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      local_7b8[3] = extraout_XMM0_Dd_14;
      afVar5 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                        *)((long)&n8 + 6),&local_7b8,(float (*) [4])auStack_778,
                       (float (*) [4])auStack_6d8);
      unique0x1000052a = (float)extraout_XMM0_Dc_15;
      auStack_6d8._0_4_ = (float)(int)afVar5._0_8_;
      auStack_6d8._4_4_ = (float)(int)((ulong)afVar5._0_8_ >> 0x20);
      unique0x1000052e = extraout_XMM0_Dd_15;
      afVar4 = ploadu<float__vector(4)>(_auStack_640 + b0._8_8_ + (c0._8_8_ + 4) * lVar1);
      local_7c8[2] = (float)extraout_XMM0_Dc_16;
      local_7c8[0] = (float)(int)afVar4._0_8_;
      local_7c8[1] = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      local_7c8[3] = extraout_XMM0_Dd_16;
      afVar5 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                        *)((long)&n8 + 6),&local_7c8,(float (*) [4])auStack_778,
                       (float (*) [4])auStack_6f8);
      unique0x10000572 = (float)extraout_XMM0_Dc_17;
      auStack_6f8._0_4_ = (float)(int)afVar5._0_8_;
      auStack_6f8._4_4_ = (float)(int)((ulong)afVar5._0_8_ >> 0x20);
      unique0x10000576 = extraout_XMM0_Dd_17;
      afVar4 = ploadu<float__vector(4)>(_auStack_640 + b0._8_8_ + (c0._8_8_ + 5) * lVar1);
      local_7d8[2] = (float)extraout_XMM0_Dc_18;
      local_7d8[0] = (float)(int)afVar4._0_8_;
      local_7d8[1] = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      local_7d8[3] = extraout_XMM0_Dd_18;
      afVar5 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                        *)((long)&n8 + 6),&local_7d8,(float (*) [4])auStack_778,
                       (float (*) [4])auStack_718);
      unique0x100005ba = (float)extraout_XMM0_Dc_19;
      auStack_718._0_4_ = (float)(int)afVar5._0_8_;
      auStack_718._4_4_ = (float)(int)((ulong)afVar5._0_8_ >> 0x20);
      unique0x100005be = extraout_XMM0_Dd_19;
      afVar4 = ploadu<float__vector(4)>(_auStack_640 + b0._8_8_ + (c0._8_8_ + 6) * lVar1);
      local_7e8[2] = (float)extraout_XMM0_Dc_20;
      local_7e8[0] = (float)(int)afVar4._0_8_;
      local_7e8[1] = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      local_7e8[3] = extraout_XMM0_Dd_20;
      afVar5 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                        *)((long)&n8 + 6),&local_7e8,(float (*) [4])auStack_778,
                       (float (*) [4])auStack_738);
      unique0x10000602 = (float)extraout_XMM0_Dc_21;
      auStack_738._0_4_ = (float)(int)afVar5._0_8_;
      auStack_738._4_4_ = (float)(int)((ulong)afVar5._0_8_ >> 0x20);
      unique0x10000606 = extraout_XMM0_Dd_21;
      afVar4 = ploadu<float__vector(4)>(_auStack_640 + b0._8_8_ + (c0._8_8_ + 7) * lVar1);
      unique0x10000626 = (float)extraout_XMM0_Dc_22;
      cc1 = (float)(int)afVar4._0_8_;
      unique0x10000622 = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      unique0x1000062a = extraout_XMM0_Dd_22;
      afVar5 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                        *)((long)&n8 + 6),(float (*) [4])&cc1,(float (*) [4])auStack_778,
                       (float (*) [4])auStack_758);
      unique0x1000064a = (float)extraout_XMM0_Dc_23;
      auStack_758._0_4_ = (float)(int)afVar5._0_8_;
      auStack_758._4_4_ = (float)(int)((ulong)afVar5._0_8_ >> 0x20);
      unique0x1000064e = extraout_XMM0_Dd_23;
    }
    cc2 = predux<float__vector(4)>((Packet4f *)auStack_678);
    cc3 = predux<float__vector(4)>((Packet4f *)auStack_698);
    cc4 = predux<float__vector(4)>((Packet4f *)auStack_6b8);
    cc5 = predux<float__vector(4)>((Packet4f *)auStack_6d8);
    cc6 = predux<float__vector(4)>((Packet4f *)auStack_6f8);
    cc7 = predux<float__vector(4)>((Packet4f *)auStack_718);
    b0_1 = predux<float__vector(4)>((Packet4f *)auStack_738);
    local_818 = predux<float__vector(4)>((Packet4f *)auStack_758);
    for (; (long)b0._8_8_ < cols; b0._8_8_ = b0._8_8_ + 1) {
      local_81c = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data
                  [b0._8_8_ * (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride];
      fVar3 = conj_helper<float,_float,_false,_false>::pmul
                        ((conj_helper<float,_float,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + b0._8_8_ + c0._8_8_ * lVar1,&local_81c);
      cc2 = fVar3 + cc2;
      fVar3 = conj_helper<float,_float,_false,_false>::pmul
                        ((conj_helper<float,_float,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + b0._8_8_ + (c0._8_8_ + 1) * lVar1,&local_81c);
      cc3 = fVar3 + cc3;
      fVar3 = conj_helper<float,_float,_false,_false>::pmul
                        ((conj_helper<float,_float,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + b0._8_8_ + (c0._8_8_ + 2) * lVar1,&local_81c);
      cc4 = fVar3 + cc4;
      fVar3 = conj_helper<float,_float,_false,_false>::pmul
                        ((conj_helper<float,_float,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + b0._8_8_ + (c0._8_8_ + 3) * lVar1,&local_81c);
      cc5 = fVar3 + cc5;
      fVar3 = conj_helper<float,_float,_false,_false>::pmul
                        ((conj_helper<float,_float,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + b0._8_8_ + (c0._8_8_ + 4) * lVar1,&local_81c);
      cc6 = fVar3 + cc6;
      fVar3 = conj_helper<float,_float,_false,_false>::pmul
                        ((conj_helper<float,_float,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + b0._8_8_ + (c0._8_8_ + 5) * lVar1,&local_81c);
      cc7 = fVar3 + cc7;
      fVar3 = conj_helper<float,_float,_false,_false>::pmul
                        ((conj_helper<float,_float,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + b0._8_8_ + (c0._8_8_ + 6) * lVar1,&local_81c);
      b0_1 = fVar3 + b0_1;
      fVar3 = conj_helper<float,_float,_false,_false>::pmul
                        ((conj_helper<float,_float,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + b0._8_8_ + (c0._8_8_ + 7) * lVar1,&local_81c);
      local_818 = fVar3 + local_818;
    }
    res[c0._8_8_ * resIncr] = alpha * cc2 + res[c0._8_8_ * resIncr];
    lVar2 = (c0._8_8_ + 1) * resIncr;
    res[lVar2] = alpha * cc3 + res[lVar2];
    lVar2 = (c0._8_8_ + 2) * resIncr;
    res[lVar2] = alpha * cc4 + res[lVar2];
    lVar2 = (c0._8_8_ + 3) * resIncr;
    res[lVar2] = alpha * cc5 + res[lVar2];
    lVar2 = (c0._8_8_ + 4) * resIncr;
    res[lVar2] = alpha * cc6 + res[lVar2];
    lVar2 = (c0._8_8_ + 5) * resIncr;
    res[lVar2] = alpha * cc7 + res[lVar2];
    lVar2 = (c0._8_8_ + 6) * resIncr;
    res[lVar2] = alpha * b0_1 + res[lVar2];
    lVar2 = (c0._8_8_ + 7) * resIncr;
    res[lVar2] = alpha * local_818 + res[lVar2];
  }
  for (; (long)c0._8_8_ < rows + -3; c0._8_8_ = c0._8_8_ + 4) {
    local_83c = 0.0;
    afVar4 = pset1<float__vector(4)>(&local_83c);
    unique0x1000066e = (float)extraout_XMM0_Dc_24;
    auStack_838._0_4_ = (float)(int)afVar4._0_8_;
    auStack_838._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
    unique0x10000672 = extraout_XMM0_Dd_24;
    local_85c = 0.0;
    afVar4 = pset1<float__vector(4)>(&local_85c);
    unique0x10000692 = (float)extraout_XMM0_Dc_25;
    auStack_858._0_4_ = (float)(int)afVar4._0_8_;
    auStack_858._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
    unique0x10000696 = extraout_XMM0_Dd_25;
    local_87c = 0.0;
    afVar4 = pset1<float__vector(4)>(&local_87c);
    unique0x100006b6 = (float)extraout_XMM0_Dc_26;
    auStack_878._0_4_ = (float)(int)afVar4._0_8_;
    auStack_878._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
    unique0x100006ba = extraout_XMM0_Dd_26;
    j_1._4_4_ = 0;
    afVar4 = pset1<float__vector(4)>((float *)((long)&j_1 + 4));
    unique0x100006da = (float)extraout_XMM0_Dc_27;
    auStack_898._0_4_ = (float)(int)afVar4._0_8_;
    auStack_898._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
    unique0x100006de = extraout_XMM0_Dd_27;
    b0_2[2] = 0.0;
    b0_2[3] = 0.0;
    for (; b0_2._8_8_ + 4 <= cols; b0_2._8_8_ = b0_2._8_8_ + 4) {
      afVar4 = ploadu<float__vector(4)>
                         ((rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data +
                          b0_2._8_8_ *
                          (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride);
      unique0x100006fe = (float)extraout_XMM0_Dc_28;
      auStack_8b8._0_4_ = (float)(int)afVar4._0_8_;
      auStack_8b8._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      unique0x10000702 = extraout_XMM0_Dd_28;
      afVar4 = ploadu<float__vector(4)>(_auStack_640 + b0_2._8_8_ + c0._8_8_ * lVar1);
      local_8c8[2] = (float)extraout_XMM0_Dc_29;
      local_8c8[0] = (float)(int)afVar4._0_8_;
      local_8c8[1] = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      local_8c8[3] = extraout_XMM0_Dd_29;
      afVar5 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                        *)((long)&n8 + 6),&local_8c8,(float (*) [4])auStack_8b8,
                       (float (*) [4])auStack_838);
      unique0x10000746 = (float)extraout_XMM0_Dc_30;
      auStack_838._0_4_ = (float)(int)afVar5._0_8_;
      auStack_838._4_4_ = (float)(int)((ulong)afVar5._0_8_ >> 0x20);
      unique0x1000074a = extraout_XMM0_Dd_30;
      afVar4 = ploadu<float__vector(4)>(_auStack_640 + b0_2._8_8_ + (c0._8_8_ + 1) * lVar1);
      local_8d8[2] = (float)extraout_XMM0_Dc_31;
      local_8d8[0] = (float)(int)afVar4._0_8_;
      local_8d8[1] = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      local_8d8[3] = extraout_XMM0_Dd_31;
      afVar5 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                        *)((long)&n8 + 6),&local_8d8,(float (*) [4])auStack_8b8,
                       (float (*) [4])auStack_858);
      unique0x1000078e = (float)extraout_XMM0_Dc_32;
      auStack_858._0_4_ = (float)(int)afVar5._0_8_;
      auStack_858._4_4_ = (float)(int)((ulong)afVar5._0_8_ >> 0x20);
      unique0x10000792 = extraout_XMM0_Dd_32;
      afVar4 = ploadu<float__vector(4)>(_auStack_640 + b0_2._8_8_ + (c0._8_8_ + 2) * lVar1);
      local_8e8[2] = (float)extraout_XMM0_Dc_33;
      local_8e8[0] = (float)(int)afVar4._0_8_;
      local_8e8[1] = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      local_8e8[3] = extraout_XMM0_Dd_33;
      afVar5 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                        *)((long)&n8 + 6),&local_8e8,(float (*) [4])auStack_8b8,
                       (float (*) [4])auStack_878);
      unique0x100007d6 = (float)extraout_XMM0_Dc_34;
      auStack_878._0_4_ = (float)(int)afVar5._0_8_;
      auStack_878._4_4_ = (float)(int)((ulong)afVar5._0_8_ >> 0x20);
      unique0x100007da = extraout_XMM0_Dd_34;
      afVar4 = ploadu<float__vector(4)>(_auStack_640 + b0_2._8_8_ + (c0._8_8_ + 3) * lVar1);
      unique0x100007fa = (float)extraout_XMM0_Dc_35;
      cc1_1 = (float)(int)afVar4._0_8_;
      unique0x100007f6 = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      unique0x100007fe = extraout_XMM0_Dd_35;
      afVar5 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                        *)((long)&n8 + 6),(float (*) [4])&cc1_1,(float (*) [4])auStack_8b8,
                       (float (*) [4])auStack_898);
      unique0x1000081e = (float)extraout_XMM0_Dc_36;
      auStack_898._0_4_ = (float)(int)afVar5._0_8_;
      auStack_898._4_4_ = (float)(int)((ulong)afVar5._0_8_ >> 0x20);
      unique0x10000822 = extraout_XMM0_Dd_36;
    }
    cc2_1 = predux<float__vector(4)>((Packet4f *)auStack_838);
    cc3_1 = predux<float__vector(4)>((Packet4f *)auStack_858);
    b0_3 = predux<float__vector(4)>((Packet4f *)auStack_878);
    local_908 = predux<float__vector(4)>((Packet4f *)auStack_898);
    for (; (long)b0_2._8_8_ < cols; b0_2._8_8_ = b0_2._8_8_ + 1) {
      local_90c = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data
                  [b0_2._8_8_ * (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride];
      fVar3 = conj_helper<float,_float,_false,_false>::pmul
                        ((conj_helper<float,_float,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + b0_2._8_8_ + c0._8_8_ * lVar1,&local_90c);
      cc2_1 = fVar3 + cc2_1;
      fVar3 = conj_helper<float,_float,_false,_false>::pmul
                        ((conj_helper<float,_float,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + b0_2._8_8_ + (c0._8_8_ + 1) * lVar1,&local_90c);
      cc3_1 = fVar3 + cc3_1;
      fVar3 = conj_helper<float,_float,_false,_false>::pmul
                        ((conj_helper<float,_float,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + b0_2._8_8_ + (c0._8_8_ + 2) * lVar1,&local_90c);
      b0_3 = fVar3 + b0_3;
      fVar3 = conj_helper<float,_float,_false,_false>::pmul
                        ((conj_helper<float,_float,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + b0_2._8_8_ + (c0._8_8_ + 3) * lVar1,&local_90c);
      local_908 = fVar3 + local_908;
    }
    res[c0._8_8_ * resIncr] = alpha * cc2_1 + res[c0._8_8_ * resIncr];
    lVar2 = (c0._8_8_ + 1) * resIncr;
    res[lVar2] = alpha * cc3_1 + res[lVar2];
    lVar2 = (c0._8_8_ + 2) * resIncr;
    res[lVar2] = alpha * b0_3 + res[lVar2];
    lVar2 = (c0._8_8_ + 3) * resIncr;
    res[lVar2] = alpha * local_908 + res[lVar2];
  }
  for (; (long)c0._8_8_ < rows + -1; c0._8_8_ = c0._8_8_ + 2) {
    local_92c = 0.0;
    afVar4 = pset1<float__vector(4)>(&local_92c);
    unique0x10000842 = (float)extraout_XMM0_Dc_37;
    auStack_928._0_4_ = (float)(int)afVar4._0_8_;
    auStack_928._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
    unique0x10000846 = extraout_XMM0_Dd_37;
    j_2._4_4_ = 0;
    afVar4 = pset1<float__vector(4)>((float *)((long)&j_2 + 4));
    unique0x10000866 = (float)extraout_XMM0_Dc_38;
    auStack_948._0_4_ = (float)(int)afVar4._0_8_;
    auStack_948._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
    unique0x1000086a = extraout_XMM0_Dd_38;
    b0_4[2] = 0.0;
    b0_4[3] = 0.0;
    for (; b0_4._8_8_ + 4 <= cols; b0_4._8_8_ = b0_4._8_8_ + 4) {
      afVar4 = ploadu<float__vector(4)>
                         ((rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data +
                          b0_4._8_8_ *
                          (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride);
      unique0x1000088a = (float)extraout_XMM0_Dc_39;
      auStack_968._0_4_ = (float)(int)afVar4._0_8_;
      auStack_968._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      unique0x1000088e = extraout_XMM0_Dd_39;
      afVar4 = ploadu<float__vector(4)>(_auStack_640 + b0_4._8_8_ + c0._8_8_ * lVar1);
      local_978[2] = (float)extraout_XMM0_Dc_40;
      local_978[0] = (float)(int)afVar4._0_8_;
      local_978[1] = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      local_978[3] = extraout_XMM0_Dd_40;
      afVar5 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                        *)((long)&n8 + 6),&local_978,(float (*) [4])auStack_968,
                       (float (*) [4])auStack_928);
      unique0x100008d2 = (float)extraout_XMM0_Dc_41;
      auStack_928._0_4_ = (float)(int)afVar5._0_8_;
      auStack_928._4_4_ = (float)(int)((ulong)afVar5._0_8_ >> 0x20);
      unique0x100008d6 = extraout_XMM0_Dd_41;
      afVar4 = ploadu<float__vector(4)>(_auStack_640 + b0_4._8_8_ + (c0._8_8_ + 1) * lVar1);
      unique0x100008f6 = (float)extraout_XMM0_Dc_42;
      cc1_2 = (float)(int)afVar4._0_8_;
      unique0x100008f2 = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      unique0x100008fa = extraout_XMM0_Dd_42;
      afVar5 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                        *)((long)&n8 + 6),(float (*) [4])&cc1_2,(float (*) [4])auStack_968,
                       (float (*) [4])auStack_948);
      unique0x1000091a = (float)extraout_XMM0_Dc_43;
      auStack_948._0_4_ = (float)(int)afVar5._0_8_;
      auStack_948._4_4_ = (float)(int)((ulong)afVar5._0_8_ >> 0x20);
      unique0x1000091e = extraout_XMM0_Dd_43;
    }
    b0_5 = predux<float__vector(4)>((Packet4f *)auStack_928);
    local_990 = predux<float__vector(4)>((Packet4f *)auStack_948);
    for (; (long)b0_4._8_8_ < cols; b0_4._8_8_ = b0_4._8_8_ + 1) {
      c0_3[3] = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data
                [b0_4._8_8_ * (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride];
      fVar3 = conj_helper<float,_float,_false,_false>::pmul
                        ((conj_helper<float,_float,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + b0_4._8_8_ + c0._8_8_ * lVar1,c0_3 + 3);
      b0_5 = fVar3 + b0_5;
      fVar3 = conj_helper<float,_float,_false,_false>::pmul
                        ((conj_helper<float,_float,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + b0_4._8_8_ + (c0._8_8_ + 1) * lVar1,c0_3 + 3);
      local_990 = fVar3 + local_990;
    }
    res[c0._8_8_ * resIncr] = alpha * b0_5 + res[c0._8_8_ * resIncr];
    lVar2 = (c0._8_8_ + 1) * resIncr;
    res[lVar2] = alpha * local_990 + res[lVar2];
  }
  for (; (long)c0._8_8_ < rows; c0._8_8_ = c0._8_8_ + 1) {
    local_9ac = 0.0;
    afVar4 = pset1<float__vector(4)>(&local_9ac);
    unique0x1000093e = (float)extraout_XMM0_Dc_44;
    auStack_9a8._0_4_ = (float)(int)afVar4._0_8_;
    auStack_9a8._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
    unique0x10000942 = extraout_XMM0_Dd_44;
    local_9cc = 0.0;
    afVar4 = pset1<float__vector(4)>(&local_9cc);
    unique0x10000962 = extraout_XMM0_Dc_45;
    auStack_9c8 = afVar4._0_8_;
    unique0x10000966 = extraout_XMM0_Dd_45;
    j_3._4_4_ = 0;
    afVar4 = pset1<float__vector(4)>((float *)((long)&j_3 + 4));
    unique0x10000986 = extraout_XMM0_Dc_46;
    auStack_9e8 = afVar4._0_8_;
    unique0x1000098a = extraout_XMM0_Dd_46;
    b0_6[2] = 0.0;
    b0_6[3] = 0.0;
    for (; b0_6._8_8_ + 4 <= cols; b0_6._8_8_ = b0_6._8_8_ + 4) {
      afVar4 = ploadu<float__vector(4)>
                         ((rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data +
                          b0_6._8_8_ *
                          (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride);
      unique0x100009aa = (float)extraout_XMM0_Dc_47;
      auStack_a08._0_4_ = (float)(int)afVar4._0_8_;
      auStack_a08._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      unique0x100009ae = extraout_XMM0_Dd_47;
      afVar4 = ploadu<float__vector(4)>(_auStack_640 + b0_6._8_8_ + c0._8_8_ * lVar1);
      afStack_a18[2] = (float)extraout_XMM0_Dc_48;
      afStack_a18[0] = (float)(int)afVar4._0_8_;
      afStack_a18[1] = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      afStack_a18[3] = extraout_XMM0_Dd_48;
      afVar5 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                        *)((long)&n8 + 6),&afStack_a18,(float (*) [4])auStack_a08,
                       (float (*) [4])auStack_9a8);
      unique0x100009f2 = (float)extraout_XMM0_Dc_49;
      auStack_9a8._0_4_ = (float)(int)afVar5._0_8_;
      auStack_9a8._4_4_ = (float)(int)((ulong)afVar5._0_8_ >> 0x20);
      unique0x100009f6 = extraout_XMM0_Dd_49;
    }
    local_a1c = predux<float__vector(4)>((Packet4f *)auStack_9a8);
    for (; (long)b0_6._8_8_ < cols; b0_6._8_8_ = b0_6._8_8_ + 1) {
      fVar3 = conj_helper<float,_float,_false,_false>::pmul
                        ((conj_helper<float,_float,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + b0_6._8_8_ + c0._8_8_ * lVar1,
                         (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data +
                         b0_6._8_8_ *
                         (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride);
      local_a1c = fVar3 + local_a1c;
    }
    res[c0._8_8_ * resIncr] = alpha * local_a1c + res[c0._8_8_ * resIncr];
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,RowMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  eigen_internal_assert(rhs.stride()==1);
  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  conj_helper<LhsPacketHalf,RhsPacketHalf,ConjugateLhs,ConjugateRhs> pcj_half;
  conj_helper<LhsPacketQuarter,RhsPacketQuarter,ConjugateLhs,ConjugateRhs> pcj_quarter;

  // TODO: fine tune the following heuristic. The rationale is that if the matrix is very large,
  //       processing 8 rows at once might be counter productive wrt cache.
  const Index n8 = lhs.stride()*sizeof(LhsScalar)>32000 ? 0 : rows-7;
  const Index n4 = rows-3;
  const Index n2 = rows-1;

  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned,
         ResPacketSize = Traits::ResPacketSize,
         ResPacketSizeHalf = HalfTraits::ResPacketSize,
         ResPacketSizeQuarter = QuarterTraits::ResPacketSize,
         LhsPacketSize = Traits::LhsPacketSize,
         LhsPacketSizeHalf = HalfTraits::LhsPacketSize,
         LhsPacketSizeQuarter = QuarterTraits::LhsPacketSize,
         HasHalf = (int)ResPacketSizeHalf < (int)ResPacketSize,
         HasQuarter = (int)ResPacketSizeQuarter < (int)ResPacketSizeHalf
  };

  Index i=0;
  for(; i<n8; i+=8)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0)),
              c4 = pset1<ResPacket>(ResScalar(0)),
              c5 = pset1<ResPacket>(ResScalar(0)),
              c6 = pset1<ResPacket>(ResScalar(0)),
              c7 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
      c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+4,j),b0,c4);
      c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+5,j),b0,c5);
      c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+6,j),b0,c6);
      c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+7,j),b0,c7);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    ResScalar cc4 = predux(c4);
    ResScalar cc5 = predux(c5);
    ResScalar cc6 = predux(c6);
    ResScalar cc7 = predux(c7);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
      cc4 += cj.pmul(lhs(i+4,j), b0);
      cc5 += cj.pmul(lhs(i+5,j), b0);
      cc6 += cj.pmul(lhs(i+6,j), b0);
      cc7 += cj.pmul(lhs(i+7,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
    res[(i+4)*resIncr] += alpha*cc4;
    res[(i+5)*resIncr] += alpha*cc5;
    res[(i+6)*resIncr] += alpha*cc6;
    res[(i+7)*resIncr] += alpha*cc7;
  }
  for(; i<n4; i+=4)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
  }
  for(; i<n2; i+=2)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
  }
  for(; i<rows; ++i)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0));
    ResPacketHalf c0_h = pset1<ResPacketHalf>(ResScalar(0));
    ResPacketQuarter c0_q = pset1<ResPacketQuarter>(ResScalar(0));
    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket,Unaligned>(j,0);
      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i,j),b0,c0);
    }
    ResScalar cc0 = predux(c0);
    if (HasHalf) {
      for(; j+LhsPacketSizeHalf<=cols; j+=LhsPacketSizeHalf)
        {
          RhsPacketHalf b0 = rhs.template load<RhsPacketHalf,Unaligned>(j,0);
          c0_h = pcj_half.pmadd(lhs.template load<LhsPacketHalf,LhsAlignment>(i,j),b0,c0_h);
        }
      cc0 += predux(c0_h);
    }
    if (HasQuarter) {
      for(; j+LhsPacketSizeQuarter<=cols; j+=LhsPacketSizeQuarter)
        {
          RhsPacketQuarter b0 = rhs.template load<RhsPacketQuarter,Unaligned>(j,0);
          c0_q = pcj_quarter.pmadd(lhs.template load<LhsPacketQuarter,LhsAlignment>(i,j),b0,c0_q);
        }
      cc0 += predux(c0_q);
    }
    for(; j<cols; ++j)
    {
      cc0 += cj.pmul(lhs(i,j), rhs(j,0));
    }
    res[i*resIncr] += alpha*cc0;
  }
}